

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_0::RelativeChangeCase::logAnalysis
          (RelativeChangeCase *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          *samples)

{
  ostringstream *poVar1;
  TestLog *this_00;
  pointer pSVar2;
  long lVar3;
  long lVar4;
  size_t ndx;
  size_t __n;
  int precision;
  void *__buf;
  float fVar5;
  float fVar6;
  allocator<char> local_276;
  allocator<char> local_275;
  LineParametersWithConfidence baseParam;
  LineParametersWithConfidence testParam;
  LineParametersWithConfidence nullParam;
  string local_220;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> testSamples;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> baseSamples;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> nullSamples;
  MessageBuilder local_1b8;
  string local_38;
  
  this_00 = ((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&nullSamples,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_1b8);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&baseSamples,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_1b8);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&testSamples,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_1b8);
  lVar4 = 0x1c;
  for (__n = 0; pSVar2 = (samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                         )._M_impl.super__Vector_impl_data._M_start,
      __n < (ulong)((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5);
      __n = __n + 1) {
    lVar3 = *(long *)((long)pSVar2 + lVar4 + -0x1c);
    nullSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[__n].m_data[0] =
         (float)*(int *)((long)&pSVar2->nullTime + lVar4);
    nullSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[__n].m_data[1] = (float)lVar3;
    lVar3 = *(long *)((long)pSVar2 + lVar4 + -0x14);
    baseSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[__n].m_data[0] =
         (float)*(int *)((long)&pSVar2->nullTime + lVar4);
    baseSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[__n].m_data[1] = (float)lVar3;
    lVar3 = *(long *)((long)pSVar2 + lVar4 + -0xc);
    testSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[__n].m_data[0] =
         (float)*(int *)((long)&pSVar2->nullTime + lVar4);
    testSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[__n].m_data[1] = (float)lVar3;
    lVar4 = lVar4 + 0x20;
  }
  deqp::gls::theilSenSiegelLinearRegression(&nullParam,&nullSamples,0.6);
  deqp::gls::theilSenSiegelLinearRegression(&baseParam,&baseSamples,0.6);
  deqp::gls::theilSenSiegelLinearRegression(&testParam,&testSamples,0.6);
  if ((0.0 < nullParam.coefficientConfidenceLower) || (nullParam.coefficientConfidenceUpper < 0.0))
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"Constant operation sequence duration not constant",
               (allocator<char> *)&local_220);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    poVar1 = &local_1b8.m_str;
    local_1b8.m_log = this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Constant operation sequence timing may vary as a function of workload. Result quality extremely low"
                   );
    tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  if ((baseParam.coefficientConfidenceLower <= 0.0) && (0.0 <= baseParam.coefficientConfidenceUpper)
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"Workload has no effect on duration",
               (allocator<char> *)&local_220);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    poVar1 = &local_1b8.m_str;
    local_1b8.m_log = this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Workload factor has no effect on duration of sample (smart optimizer?)");
    tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Linear Regression",&local_275);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Linear Regression",&local_276);
  tcu::LogSection::LogSection((LogSection *)&local_1b8,&local_220,&local_38);
  tcu::LogSection::write((LogSection *)&local_1b8,(int)this_00,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_220);
  poVar1 = &local_1b8.m_str;
  local_1b8.m_log = this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is "
                 );
  std::ostream::operator<<(poVar1,0.6);
  tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b8.m_str;
  local_1b8.m_log = this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Render time for empty scene was\n\t");
  std::operator<<((ostream *)poVar1,"[");
  std::ostream::operator<<(poVar1,nullParam.offsetConfidenceLower);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,nullParam.offset);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,nullParam.offsetConfidenceUpper);
  std::operator<<((ostream *)poVar1,"]us +");
  std::operator<<((ostream *)poVar1,"[");
  std::ostream::operator<<(poVar1,nullParam.coefficientConfidenceLower);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,nullParam.coefficient);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,nullParam.coefficientConfidenceUpper);
  std::operator<<((ostream *)poVar1,"]");
  std::operator<<((ostream *)poVar1,"us/workload");
  tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b8.m_str;
  local_1b8.m_log = this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Render time for scene without depth test was\n\t");
  std::operator<<((ostream *)poVar1,"[");
  std::ostream::operator<<(poVar1,baseParam.offsetConfidenceLower);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,baseParam.offset);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,baseParam.offsetConfidenceUpper);
  std::operator<<((ostream *)poVar1,"]us +");
  std::operator<<((ostream *)poVar1,"[");
  std::ostream::operator<<(poVar1,baseParam.coefficientConfidenceLower);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,baseParam.coefficient);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,baseParam.coefficientConfidenceUpper);
  std::operator<<((ostream *)poVar1,"]");
  std::operator<<((ostream *)poVar1,"us/workload");
  tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b8.m_str;
  local_1b8.m_log = this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Render time for scene with depth test was\n\t");
  std::operator<<((ostream *)poVar1,"[");
  std::ostream::operator<<(poVar1,testParam.offsetConfidenceLower);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,testParam.offset);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,testParam.offsetConfidenceUpper);
  std::operator<<((ostream *)poVar1,"]us +");
  std::operator<<((ostream *)poVar1,"[");
  std::ostream::operator<<(poVar1,testParam.coefficientConfidenceLower);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,testParam.coefficient);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,testParam.coefficientConfidenceUpper);
  std::operator<<((ostream *)poVar1,"]");
  std::operator<<((ostream *)poVar1,"us/workload");
  tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  tcu::TestLog::endSection(this_00);
  if ((0.0 < testParam.coefficientConfidenceLower) || (testParam.coefficientConfidenceUpper < 0.0))
  {
    if (testParam.coefficientConfidenceUpper * 0.25 <= testParam.coefficientConfidenceLower) {
      poVar1 = &local_1b8.m_str;
      if (baseParam.coefficientConfidenceUpper * 0.25 <= baseParam.coefficientConfidenceLower) {
        local_1b8.m_log = this_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Test duration is dependent on culled workload");
        tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        fVar5 = -testParam.coefficient;
        if (-testParam.coefficient <= testParam.coefficient) {
          fVar5 = testParam.coefficient;
        }
        fVar6 = -baseParam.coefficient;
        if (-baseParam.coefficient <= baseParam.coefficient) {
          fVar6 = baseParam.coefficient;
        }
        de::floatToString_abi_cxx11_((string *)&local_1b8,(de *)0x2,fVar5 / fVar6,precision);
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)&local_1b8);
      }
      else {
        local_1b8.m_log = this_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,
                        "Coefficient confidence range for base render time is extremely large, cannot give reliable result"
                       );
        tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"Result confidence extremely low",
                   (allocator<char> *)&local_220);
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)&local_1b8);
      }
    }
    else {
      poVar1 = &local_1b8.m_str;
      local_1b8.m_log = this_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,
                      "Coefficient confidence range is extremely large, cannot give reliable result"
                     );
      tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"Result confidence extremely low",
                 (allocator<char> *)&local_220);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)&local_1b8);
    }
  }
  else {
    poVar1 = &local_1b8.m_str;
    local_1b8.m_log = this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Test duration not dependent on culled workload");
    tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"0.0",(allocator<char> *)&local_220);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)&local_1b8);
  }
  std::__cxx11::string::~string((string *)&local_1b8);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&testSamples.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&baseSamples.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&nullSamples.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return;
}

Assistant:

void RelativeChangeCase::logAnalysis (const vector<Sample>& samples)
{
	using namespace gls;

	TestLog&		log			= m_testCtx.getLog();

	int				maxWorkload	= 0;

	vector<Vec2>	nullSamples	(samples.size());
	vector<Vec2>	baseSamples	(samples.size());
	vector<Vec2>	testSamples	(samples.size());

	for (size_t ndx = 0; ndx < samples.size(); ndx++)
	{
		const Sample& sample = samples[ndx];

		nullSamples[ndx] = Vec2((float)sample.workload, (float)sample.nullTime);
		baseSamples[ndx] = Vec2((float)sample.workload, (float)sample.baseTime);
		testSamples[ndx] = Vec2((float)sample.workload, (float)sample.testTime);

		maxWorkload = de::max(maxWorkload, sample.workload);
	}

	{
		const float							confidence	= 0.60f;

		const LineParametersWithConfidence	nullParam	= theilSenSiegelLinearRegression(nullSamples, confidence);
		const LineParametersWithConfidence	baseParam	= theilSenSiegelLinearRegression(baseSamples, confidence);
		const LineParametersWithConfidence	testParam	= theilSenSiegelLinearRegression(testSamples, confidence);

		if (!de::inRange(0.0f, nullParam.coefficientConfidenceLower, nullParam.coefficientConfidenceUpper))
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Constant operation sequence duration not constant");
			log << TestLog::Message << "Constant operation sequence timing may vary as a function of workload. Result quality extremely low" << TestLog::EndMessage;
		}

		if (de::inRange(0.0f, baseParam.coefficientConfidenceLower, baseParam.coefficientConfidenceUpper))
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Workload has no effect on duration");
			log << TestLog::Message << "Workload factor has no effect on duration of sample (smart optimizer?)" << TestLog::EndMessage;
		}

		log << TestLog::Section("Linear Regression", "Linear Regression");
		log << TestLog::Message << "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is " << confidence << TestLog::EndMessage;

		log << TestLog::Message << "Render time for empty scene was\n\t"
			<< "[" << nullParam.offsetConfidenceLower << ", " << nullParam.offset <<  ", " << nullParam.offsetConfidenceUpper << "]us +"
			<< "[" << nullParam.coefficientConfidenceLower << ", " << nullParam.coefficient << ", " << nullParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;

		log << TestLog::Message << "Render time for scene without depth test was\n\t"
			<< "[" << baseParam.offsetConfidenceLower << ", " << baseParam.offset <<  ", " << baseParam.offsetConfidenceUpper << "]us +"
			<< "[" << baseParam.coefficientConfidenceLower << ", " << baseParam.coefficient << ", " << baseParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;

		log << TestLog::Message << "Render time for scene with depth test was\n\t"
			<< "[" << testParam.offsetConfidenceLower << ", " << testParam.offset <<  ", " << testParam.offsetConfidenceUpper << "]us +"
			<< "[" << testParam.coefficientConfidenceLower << ", " << testParam.coefficient << ", " << testParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;

		log << TestLog::EndSection;

		if (de::inRange(0.0f, testParam.coefficientConfidenceLower, testParam.coefficientConfidenceUpper))
		{
			log << TestLog::Message << "Test duration not dependent on culled workload" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "0.0");
		}
		else if (testParam.coefficientConfidenceLower < testParam.coefficientConfidenceUpper*0.25)
		{
			log << TestLog::Message << "Coefficient confidence range is extremely large, cannot give reliable result" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Result confidence extremely low");
		}
		else if (baseParam.coefficientConfidenceLower < baseParam.coefficientConfidenceUpper*0.25)
		{
			log << TestLog::Message << "Coefficient confidence range for base render time is extremely large, cannot give reliable result" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Result confidence extremely low");
		}
		else
		{
			log << TestLog::Message << "Test duration is dependent on culled workload" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, de::floatToString(de::abs(testParam.coefficient)/de::abs(baseParam.coefficient), 2));
		}
	}
}